

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_int32 *
drwav_open_memory_and_read_s32
          (void *data,size_t dataSize,uint *channels,uint *sampleRate,drwav_uint64 *totalSampleCount
          )

{
  drwav_bool32 dVar1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined8 *in_R8;
  drwav wav;
  void *in_stack_fffffffffffffe28;
  drwav *in_stack_fffffffffffffe30;
  drwav_uint64 *in_stack_fffffffffffffe40;
  uint *in_stack_fffffffffffffe48;
  uint *in_stack_fffffffffffffe50;
  drwav *in_stack_fffffffffffffe58;
  undefined8 local_8;
  
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = 0;
  }
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = 0;
  }
  if (in_R8 != (undefined8 *)0x0) {
    *in_R8 = 0;
  }
  dVar1 = drwav_init_memory(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,0x113485);
  if (dVar1 == 0) {
    local_8 = (drwav_int32 *)0x0;
  }
  else {
    local_8 = drwav__read_and_close_s32
                        (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                         in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  }
  return local_8;
}

Assistant:

drwav_int32* drwav_open_memory_and_read_s32(const void* data, size_t dataSize, unsigned int* channels, unsigned int* sampleRate, drwav_uint64* totalSampleCount)
{
    if (sampleRate) *sampleRate = 0;
    if (channels) *channels = 0;
    if (totalSampleCount) *totalSampleCount = 0;

    drwav wav;
    if (!drwav_init_memory(&wav, data, dataSize)) {
        return NULL;
    }

    return drwav__read_and_close_s32(&wav, channels, sampleRate, totalSampleCount);
}